

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O3

int lj_cf_buffer_method_putf(lua_State *L)

{
  uint64_t uVar1;
  SBufExt *sb;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)((uint)(sb->L).ptr64 & 7) | (ulong)L;
  lj_strfmt_putarg(L,(SBuf *)sb,2,2);
  uVar1 = (L->glref).ptr64;
  L->top = L->base + 1;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_putf)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  lj_strfmt_putarg(L, (SBuf *)sbx, 2, 2);
  L->top = L->base+1;  /* Chain buffer object. */
  lj_gc_check(L);
  return 1;
}